

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> * __thiscall
MPLSParser::getPgStreams
          (vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *__return_storage_ptr__,
          MPLSParser *this)

{
  bool bVar1;
  reference __x;
  StreamType coding_type;
  MPLSStreamInfo *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *__range1;
  MPLSParser *this_local;
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *pgStreams;
  
  std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::begin(&this->m_streamInfo);
  i = (MPLSStreamInfo *)
      std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::end(&this->m_streamInfo);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_MPLSStreamInfo_*,_std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>_>
                                     *)&i), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<const_MPLSStreamInfo_*,_std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>_>
          ::operator*(&__end1);
    if ((__x->super_M2TSStreamInfo).stream_coding_type == SUB_PGS) {
      std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::push_back
                (__return_storage_ptr__,__x);
    }
    __gnu_cxx::
    __normal_iterator<const_MPLSStreamInfo_*,_std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<MPLSStreamInfo> MPLSParser::getPgStreams() const
{
    std::vector<MPLSStreamInfo> pgStreams;
    for (auto& i : m_streamInfo)
    {
        const StreamType coding_type = i.stream_coding_type;
        if (coding_type == StreamType::SUB_PGS)
            pgStreams.push_back(i);
    }
    return pgStreams;
}